

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrStringToPath(XrInstance instance,char *pathString,XrPath *path)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrPath *path_local;
  char *pathString_local;
  XrInstance instance_local;
  
  loader_instance = (LoaderInstance *)path;
  path_local = (XrPath *)pathString;
  pathString_local = (char *)instance;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrStringToPath");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->StringToPath)
                         ((XrInstance)pathString_local,(char *)path_local,(XrPath *)loader_instance)
    ;
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrStringToPath(
    XrInstance                                  instance,
    const char*                                 pathString,
    XrPath*                                     path) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrStringToPath");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->StringToPath(instance, pathString, path);
    }
    return result;
}